

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_space_hierarchic_tests.cc
# Opt level: O3

void __thiscall
lf::fe::test::fe_space_hierarchic_legendre_orthogonality_Test::
~fe_space_hierarchic_legendre_orthogonality_Test
          (fe_space_hierarchic_legendre_orthogonality_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fe_space_hierarchic, legendre_orthogonality) {
  // Maximum degrees of Legendre polynomials to test
  const int N = 20;
  const int M = 20;
  // Compute the inner product of the n-th and m-th Legendre polynomial
  // and compare it to the analytic solution
  for (int n = 0; n < N; ++n) {
    for (int m = 0; m < M; ++m) {
      const int degree = n + m;
      const int num_points = degree / 2 + 1;
      const auto [points, weights] = lf::quad::GaussLegendre(num_points);
      // Integrate the product of the n-th and m-th legendre polynomial
      // to check whether the norm is as expected
      double result = 0;
      for (int i = 0; i < num_points; ++i) {
        const double Ln = lf::fe::Legendre(n, points[i]);
        const double Lm = lf::fe::Legendre(m, points[i]);
        result += weights[i] * Ln * Lm;
      }
      const double expected = n == m ? 1. / (2 * n + 1) : 0.;
      ASSERT_NEAR(result, expected, 1e-8) << "n=" << n << " m=" << m;
    }
  }
}